

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

int ED25519_sign(uint8_t *out_sig,uint8_t *message,size_t message_len,uint8_t *private_key)

{
  uchar local_268 [8];
  uint8_t hram [64];
  ge_p3 R;
  uint8_t nonce [64];
  undefined1 local_140 [8];
  SHA512_CTX hash_ctx;
  uint8_t az [64];
  uint8_t *private_key_local;
  size_t message_len_local;
  uint8_t *message_local;
  uint8_t *out_sig_local;
  
  az._56_8_ = private_key;
  SHA512(private_key,0x20,(uchar *)&hash_ctx.num);
  hash_ctx.num._0_1_ = (byte)hash_ctx.num & 0xf8;
  az[0x17] = az[0x17] & 0x3f | 0x40;
  SHA512_Init((SHA512_CTX *)local_140);
  SHA512_Update((SHA512_CTX *)local_140,az + 0x18,0x20);
  SHA512_Update((SHA512_CTX *)local_140,message,message_len);
  SHA512_Final((uchar *)(R.T.v + 4),(SHA512_CTX *)local_140);
  x25519_sc_reduce((uint8_t *)(R.T.v + 4));
  x25519_ge_scalarmult_base((ge_p3 *)(hram + 0x38),(uint8_t *)(R.T.v + 4));
  ge_p3_tobytes(out_sig,(ge_p3 *)(hram + 0x38));
  SHA512_Init((SHA512_CTX *)local_140);
  SHA512_Update((SHA512_CTX *)local_140,out_sig,0x20);
  SHA512_Update((SHA512_CTX *)local_140,(void *)(az._56_8_ + 0x20),0x20);
  SHA512_Update((SHA512_CTX *)local_140,message,message_len);
  SHA512_Final(local_268,(SHA512_CTX *)local_140);
  x25519_sc_reduce(local_268);
  sc_muladd(out_sig + 0x20,local_268,(uint8_t *)&hash_ctx.num,(uint8_t *)(R.T.v + 4));
  return 1;
}

Assistant:

int ED25519_sign(uint8_t out_sig[64], const uint8_t *message,
                 size_t message_len, const uint8_t private_key[64]) {
  // NOTE: The documentation on this function says that it returns zero on
  // allocation failure. While that can't happen with the current
  // implementation, we want to reserve the ability to allocate in this
  // implementation in the future.

  uint8_t az[SHA512_DIGEST_LENGTH];
  SHA512(private_key, 32, az);

  az[0] &= 248;
  az[31] &= 63;
  az[31] |= 64;

  SHA512_CTX hash_ctx;
  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, az + 32, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t nonce[SHA512_DIGEST_LENGTH];
  SHA512_Final(nonce, &hash_ctx);

  x25519_sc_reduce(nonce);
  ge_p3 R;
  x25519_ge_scalarmult_base(&R, nonce);
  ge_p3_tobytes(out_sig, &R);

  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, out_sig, 32);
  SHA512_Update(&hash_ctx, private_key + 32, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t hram[SHA512_DIGEST_LENGTH];
  SHA512_Final(hram, &hash_ctx);

  x25519_sc_reduce(hram);
  sc_muladd(out_sig + 32, hram, az, nonce);

  // The signature is computed from the private key, but is public.
  CONSTTIME_DECLASSIFY(out_sig, 64);
  return 1;
}